

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O0

StatusCode __thiscall HttpConn::parseBody(HttpConn *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  mapped_type *__str;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  int local_cc;
  allocator<char> local_a1;
  string local_a0 [37];
  byte local_7b;
  byte local_7a;
  allocator local_79;
  key_type local_78;
  allocator local_41;
  key_type local_40;
  int local_1c;
  HttpConn *pHStack_18;
  int contentLen;
  HttpConn *this_local;
  
  pHStack_18 = this;
  std::allocator<char>::allocator();
  local_7a = 0;
  local_7b = 0;
  std::__cxx11::string::string((string *)&local_40,"Content-Length",&local_41);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&this->headers_,&local_40);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string((string *)&local_78,"Content-Length",&local_79);
    local_7b = 1;
    __str = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->headers_,&local_78);
    local_cc = std::__cxx11::stoi(__str,(size_t *)0x0,10);
  }
  else {
    local_cc = 0;
  }
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_1c = local_cc;
  if (this->read_idx_ < local_cc + this->checked_idx_) {
    this_local._4_4_ = Wait;
  }
  else {
    pcVar4 = std::vector<char,_std::allocator<char>_>::data(&this->readBuff_);
    iVar1 = this->checked_idx_;
    pcVar5 = std::vector<char,_std::allocator<char>_>::data(&this->readBuff_);
    iVar2 = this->checked_idx_;
    lVar6 = (long)local_1c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char*,void>
              (local_a0,pcVar4 + iVar1,pcVar5 + lVar6 + iVar2,&local_a1);
    std::__cxx11::string::operator=((string *)&this->requestBody_,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
    this->checked_idx_ = local_1c + this->checked_idx_;
    this_local._4_4_ = OK;
  }
  return this_local._4_4_;
}

Assistant:

HttpConn::StatusCode HttpConn::parseBody() {
    int contentLen = headers_["Content-Length"].empty() ? 0 : std::stoi(headers_["Content-Length"]);
    if (read_idx_ >= contentLen + checked_idx_) {
        requestBody_ = std::string(readBuff_.data() + checked_idx_, readBuff_.data() + checked_idx_ + contentLen);
        checked_idx_ += contentLen;
        return OK;
    } 
    else return Wait;
}